

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_to_bip143_bytes(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,uchar *bytes_out,
                      size_t len,size_t *written)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 *puVar7;
  wally_tx_input *pwVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  size_t local_510;
  ulong local_508;
  ulong local_500;
  uchar *local_4b8;
  uchar *tmp_p_1;
  uchar *tmp_p;
  uchar *puStack_4a0;
  int ret;
  uchar *output_p;
  uchar *p;
  _Bool sh_single;
  _Bool sh_none;
  _Bool sh_rangeproof;
  size_t sStack_488;
  _Bool anyonecanpay;
  size_t is_elements;
  size_t buff_len;
  size_t issuances_size;
  size_t rangeproof_size;
  size_t outputs_size;
  size_t inputs_size;
  size_t i;
  uchar *buff_p;
  uchar buff [1024];
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  tx_serialize_opts *opts_local;
  wally_tx *tx_local;
  
  i = (size_t)&buff_p;
  issuances_size = 0;
  buff_len = 0;
  is_elements = 0x400;
  sStack_488 = 0;
  bVar9 = (opts->sighash & 0x80) != 0;
  bVar10 = (opts->sighash & 0x40) != 0;
  bVar11 = (opts->sighash & 0x1f) == 2;
  bVar12 = (opts->sighash & 0x1f) == 3;
  iVar1 = wally_tx_is_elements(tx,&stack0xfffffffffffffb78);
  if (iVar1 != 0) {
    return iVar1;
  }
  sVar2 = uint32_to_le_bytes(tx->version,bytes_out);
  puVar3 = bytes_out + sVar2;
  outputs_size = tx->num_inputs * 0x24;
  if ((bVar11) || ((bVar12 && (tx->num_outputs <= opts->index)))) {
    rangeproof_size = 0;
  }
  else if (bVar12) {
    if (sStack_488 == 0) {
      sVar2 = varbuff_get_length(tx->outputs[opts->index].script_len);
      rangeproof_size = sVar2 + 8;
    }
    else {
      sVar2 = confidential_asset_length_from_bytes(tx->outputs[opts->index].asset);
      sVar6 = confidential_value_length_from_bytes(tx->outputs[opts->index].value);
      sVar4 = confidential_nonce_length_from_bytes(tx->outputs[opts->index].nonce);
      sVar5 = varbuff_get_length(tx->outputs[opts->index].script_len);
      rangeproof_size = sVar2 + sVar6 + sVar4 + sVar5;
      if (bVar10) {
        sVar2 = varbuff_get_length(tx->outputs[opts->index].rangeproof_len);
        sVar6 = varbuff_get_length(tx->outputs[opts->index].surjectionproof_len);
        issuances_size = sVar2 + sVar6;
      }
    }
  }
  else {
    rangeproof_size = 0;
    issuances_size = 0;
    for (inputs_size = 0; inputs_size < tx->num_outputs; inputs_size = inputs_size + 1) {
      if (sStack_488 == 0) {
        rangeproof_size = rangeproof_size + 8;
      }
      else {
        sVar2 = confidential_asset_length_from_bytes(tx->outputs[inputs_size].asset);
        sVar6 = confidential_value_length_from_bytes(tx->outputs[inputs_size].value);
        sVar4 = confidential_nonce_length_from_bytes(tx->outputs[inputs_size].nonce);
        rangeproof_size = sVar2 + sVar6 + sVar4 + rangeproof_size;
        if (bVar10) {
          sVar2 = varbuff_get_length(tx->outputs[inputs_size].rangeproof_len);
          sVar6 = varbuff_get_length(tx->outputs[inputs_size].surjectionproof_len);
          issuances_size = sVar2 + sVar6 + issuances_size;
        }
      }
      sVar2 = varbuff_get_length(tx->outputs[inputs_size].script_len);
      rangeproof_size = sVar2 + rangeproof_size;
    }
  }
  if ((sStack_488 != 0) && (!bVar9)) {
    for (inputs_size = 0; inputs_size < tx->num_inputs; inputs_size = inputs_size + 1) {
      if ((tx->inputs[inputs_size].features & 2) == 0) {
        buff_len = buff_len + 1;
      }
      else {
        sVar2 = confidential_value_length_from_bytes(tx->inputs[inputs_size].issuance_amount);
        sVar6 = confidential_value_length_from_bytes(tx->inputs[inputs_size].inflation_keys);
        buff_len = sVar2 + 0x40 + sVar6 + buff_len;
      }
    }
  }
  if ((((is_elements < outputs_size) || (is_elements < rangeproof_size)) ||
      (is_elements < issuances_size)) || (is_elements < buff_len)) {
    if (rangeproof_size < outputs_size) {
      local_500 = outputs_size;
    }
    else {
      local_500 = rangeproof_size;
    }
    if (issuances_size < local_500) {
      local_508 = local_500;
    }
    else {
      local_508 = issuances_size;
    }
    if (buff_len < local_508) {
      local_510 = local_508;
    }
    else {
      local_510 = buff_len;
    }
    is_elements = local_510;
    i = (size_t)wally_malloc(local_510);
    if ((void *)i == (void *)0x0) {
      return -3;
    }
  }
  if (bVar9) {
    memset(puVar3,0,0x20);
    tmp_p._4_4_ = 0;
  }
  else {
    for (inputs_size = 0; inputs_size < tx->num_inputs; inputs_size = inputs_size + 1) {
      puVar7 = (undefined8 *)(i + inputs_size * 0x24);
      pwVar8 = tx->inputs + inputs_size;
      *puVar7 = *(undefined8 *)pwVar8->txhash;
      puVar7[1] = *(undefined8 *)(pwVar8->txhash + 8);
      puVar7[2] = *(undefined8 *)(pwVar8->txhash + 0x10);
      puVar7[3] = *(undefined8 *)(pwVar8->txhash + 0x18);
      uint32_to_le_bytes(tx->inputs[inputs_size].index,(uchar *)(puVar7 + 4));
    }
    tmp_p._4_4_ = wally_sha256d((uchar *)i,outputs_size,puVar3,0x20);
    if (tmp_p._4_4_ != 0) goto LAB_0010b3da;
  }
  if (((bVar9) || (bVar12)) || (bVar11)) {
    memset(puVar3 + 0x20,0,0x20);
  }
  else {
    for (inputs_size = 0; inputs_size < tx->num_inputs; inputs_size = inputs_size + 1) {
      uint32_to_le_bytes(tx->inputs[inputs_size].sequence,(uchar *)(i + inputs_size * 4));
    }
    tmp_p._4_4_ = wally_sha256d((uchar *)i,tx->num_inputs << 2,puVar3 + 0x20,0x20);
    if (tmp_p._4_4_ != 0) goto LAB_0010b3da;
  }
  output_p = puVar3 + 0x40;
  if (sStack_488 != 0) {
    if (bVar9) {
      memset(output_p,0,0x20);
    }
    else {
      local_4b8 = (uchar *)i;
      for (inputs_size = 0; inputs_size < tx->num_inputs; inputs_size = inputs_size + 1) {
        if ((tx->inputs[inputs_size].features & 2) == 0) {
          *local_4b8 = '\0';
          local_4b8 = local_4b8 + 1;
        }
        else {
          pwVar8 = tx->inputs;
          *(undefined8 *)local_4b8 = *(undefined8 *)pwVar8[inputs_size].blinding_nonce;
          *(undefined8 *)(local_4b8 + 8) = *(undefined8 *)(pwVar8[inputs_size].blinding_nonce + 8);
          *(undefined8 *)(local_4b8 + 0x10) =
               *(undefined8 *)(pwVar8[inputs_size].blinding_nonce + 0x10);
          *(undefined8 *)(local_4b8 + 0x18) =
               *(undefined8 *)(pwVar8[inputs_size].blinding_nonce + 0x18);
          pwVar8 = tx->inputs;
          *(undefined8 *)(local_4b8 + 0x20) = *(undefined8 *)pwVar8[inputs_size].entropy;
          *(undefined8 *)(local_4b8 + 0x28) = *(undefined8 *)(pwVar8[inputs_size].entropy + 8);
          *(undefined8 *)(local_4b8 + 0x30) = *(undefined8 *)(pwVar8[inputs_size].entropy + 0x10);
          *(undefined8 *)(local_4b8 + 0x38) = *(undefined8 *)(pwVar8[inputs_size].entropy + 0x18);
          local_4b8 = local_4b8 + 0x40;
          sVar2 = confidential_value_to_bytes
                            (tx->inputs[inputs_size].issuance_amount,
                             tx->inputs[inputs_size].issuance_amount_len,local_4b8);
          sVar6 = confidential_value_to_bytes
                            (tx->inputs[inputs_size].inflation_keys,
                             tx->inputs[inputs_size].inflation_keys_len,local_4b8 + sVar2);
          local_4b8 = local_4b8 + sVar2 + sVar6;
        }
      }
      tmp_p._4_4_ = wally_sha256d((uchar *)i,buff_len,output_p,0x20);
      if (tmp_p._4_4_ != 0) goto LAB_0010b3da;
    }
    output_p = puVar3 + 0x60;
  }
  pwVar8 = tx->inputs + opts->index;
  *(undefined8 *)output_p = *(undefined8 *)pwVar8->txhash;
  *(undefined8 *)(output_p + 8) = *(undefined8 *)(pwVar8->txhash + 8);
  *(undefined8 *)(output_p + 0x10) = *(undefined8 *)(pwVar8->txhash + 0x10);
  *(undefined8 *)(output_p + 0x18) = *(undefined8 *)(pwVar8->txhash + 0x18);
  puVar3 = output_p + 0x20;
  sVar2 = uint32_to_le_bytes(tx->inputs[opts->index].index,puVar3);
  sVar6 = varbuff_to_bytes(opts->script,opts->script_len,puVar3 + sVar2);
  puVar3 = puVar3 + sVar2 + sVar6;
  if (sStack_488 == 0) {
    sVar2 = uint64_to_le_bytes(opts->satoshi,puVar3);
  }
  else {
    sVar2 = confidential_value_to_bytes(opts->value,opts->value_len,puVar3);
  }
  output_p = puVar3 + sVar2;
  sVar2 = uint32_to_le_bytes(tx->inputs[opts->index].sequence,output_p);
  output_p = output_p + sVar2;
  if ((sStack_488 != 0) && ((tx->inputs[opts->index].features & 2) != 0)) {
    pwVar8 = tx->inputs;
    sVar2 = opts->index;
    *(undefined8 *)output_p = *(undefined8 *)pwVar8[sVar2].blinding_nonce;
    *(undefined8 *)(output_p + 8) = *(undefined8 *)(pwVar8[sVar2].blinding_nonce + 8);
    *(undefined8 *)(output_p + 0x10) = *(undefined8 *)(pwVar8[sVar2].blinding_nonce + 0x10);
    *(undefined8 *)(output_p + 0x18) = *(undefined8 *)(pwVar8[sVar2].blinding_nonce + 0x18);
    pwVar8 = tx->inputs;
    sVar2 = opts->index;
    *(undefined8 *)(output_p + 0x20) = *(undefined8 *)pwVar8[sVar2].entropy;
    *(undefined8 *)(output_p + 0x28) = *(undefined8 *)(pwVar8[sVar2].entropy + 8);
    *(undefined8 *)(output_p + 0x30) = *(undefined8 *)(pwVar8[sVar2].entropy + 0x10);
    *(undefined8 *)(output_p + 0x38) = *(undefined8 *)(pwVar8[sVar2].entropy + 0x18);
    puVar3 = output_p + 0x40;
    sVar2 = confidential_value_to_bytes
                      (tx->inputs[opts->index].issuance_amount,
                       tx->inputs[opts->index].issuance_amount_len,puVar3);
    sVar6 = confidential_value_to_bytes
                      (tx->inputs[opts->index].inflation_keys,
                       tx->inputs[opts->index].inflation_keys_len,puVar3 + sVar2);
    output_p = puVar3 + sVar2 + sVar6;
  }
  if ((bVar11) || ((bVar12 && (tx->num_outputs <= opts->index)))) {
    memset(output_p,0,0x20);
  }
  else {
    puStack_4a0 = (uchar *)i;
    for (inputs_size = 0; inputs_size < tx->num_outputs; inputs_size = inputs_size + 1) {
      if ((!bVar12) || (inputs_size == opts->index)) {
        if (sStack_488 == 0) {
          sVar2 = uint64_to_le_bytes(tx->outputs[inputs_size].satoshi,puStack_4a0);
          puStack_4a0 = puStack_4a0 + sVar2;
        }
        else {
          sVar2 = confidential_value_to_bytes
                            (tx->outputs[inputs_size].asset,tx->outputs[inputs_size].asset_len,
                             puStack_4a0);
          puStack_4a0 = puStack_4a0 + sVar2;
          sVar2 = confidential_value_to_bytes
                            (tx->outputs[inputs_size].value,tx->outputs[inputs_size].value_len,
                             puStack_4a0);
          sVar6 = confidential_value_to_bytes
                            (tx->outputs[inputs_size].nonce,tx->outputs[inputs_size].nonce_len,
                             puStack_4a0 + sVar2);
          puStack_4a0 = puStack_4a0 + sVar2 + sVar6;
        }
        sVar2 = varbuff_to_bytes(tx->outputs[inputs_size].script,tx->outputs[inputs_size].script_len
                                 ,puStack_4a0);
        puStack_4a0 = puStack_4a0 + sVar2;
      }
    }
    tmp_p._4_4_ = wally_sha256d((uchar *)i,rangeproof_size,output_p,0x20);
    if (tmp_p._4_4_ != 0) goto LAB_0010b3da;
  }
  puVar3 = output_p + 0x20;
  if ((sStack_488 != 0) && (bVar10)) {
    if ((bVar11) || ((bVar12 && (tx->num_outputs <= opts->index)))) {
      memset(puVar3,0,0x20);
    }
    else {
      puStack_4a0 = (uchar *)i;
      for (inputs_size = 0; inputs_size < tx->num_outputs; inputs_size = inputs_size + 1) {
        if ((!bVar12) || (inputs_size == opts->index)) {
          sVar2 = varbuff_to_bytes(tx->outputs[inputs_size].rangeproof,
                                   tx->outputs[inputs_size].rangeproof_len,puStack_4a0);
          sVar6 = varbuff_to_bytes(tx->outputs[inputs_size].surjectionproof,
                                   tx->outputs[inputs_size].surjectionproof_len,puStack_4a0 + sVar2)
          ;
          puStack_4a0 = puStack_4a0 + sVar2 + sVar6;
        }
      }
      tmp_p._4_4_ = wally_sha256d((uchar *)i,issuances_size,puVar3,0x20);
      if (tmp_p._4_4_ != 0) goto LAB_0010b3da;
    }
    puVar3 = output_p + 0x40;
  }
  output_p = puVar3;
  sVar2 = uint32_to_le_bytes(tx->locktime,output_p);
  sVar6 = uint32_to_le_bytes(opts->tx_sighash,output_p + sVar2);
  *written = (size_t)(output_p + sVar2 + (sVar6 - (long)bytes_out));
LAB_0010b3da:
  if ((uchar **)i == &buff_p) {
    wally_clear(&buff_p,0x400);
  }
  else {
    clear_and_free((void *)i,is_elements);
  }
  return tmp_p._4_4_;
}

Assistant:

static inline int tx_to_bip143_bytes(const struct wally_tx *tx,
                                     const struct tx_serialize_opts *opts,
                                     uint32_t flags,
                                     unsigned char *bytes_out, size_t len,
                                     size_t *written)
{
    unsigned char buff[TX_STACK_SIZE / 2], *buff_p = buff;
    size_t i, inputs_size, outputs_size, rangeproof_size = 0, issuances_size = 0, buff_len = sizeof(buff);
    size_t is_elements = 0;
    const bool anyonecanpay = opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
#ifdef BUILD_ELEMENTS
    const bool sh_rangeproof = opts->sighash & WALLY_SIGHASH_RANGEPROOF;
#endif
    const bool sh_none = (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;
    unsigned char *p = bytes_out, *output_p;
    int ret = WALLY_OK;

    (void)flags;
    (void)len;

#ifdef BUILD_ELEMENTS
    if ((ret = wally_tx_is_elements(tx, &is_elements)) != WALLY_OK)
        return ret;
#endif

    /* Note we assume tx_to_bytes has already validated all inputs */
    p += uint32_to_le_bytes(tx->version, p);

    inputs_size = tx->num_inputs * (WALLY_TXHASH_LEN + sizeof(uint32_t));
    if (sh_none || (sh_single && opts->index >= tx->num_outputs))
        outputs_size = 0;
    else if (sh_single) {
        if (!is_elements)
            outputs_size = sizeof(uint64_t) +
                           varbuff_get_length(tx->outputs[opts->index].script_len);
#ifdef BUILD_ELEMENTS
        else {
            outputs_size = confidential_asset_length_from_bytes(tx->outputs[opts->index].asset) +
                           confidential_value_length_from_bytes(tx->outputs[opts->index].value) +
                           confidential_nonce_length_from_bytes(tx->outputs[opts->index].nonce) +
                           varbuff_get_length(tx->outputs[opts->index].script_len);

            if (sh_rangeproof) {
                rangeproof_size = varbuff_get_length(tx->outputs[opts->index].rangeproof_len) +
                                  varbuff_get_length(tx->outputs[opts->index].surjectionproof_len);
            }
        }
#else
        else
            return WALLY_EINVAL;
#endif
    } else {
        outputs_size = 0;
        rangeproof_size = 0;
        for (i = 0; i < tx->num_outputs; ++i) {
            if (!is_elements)
                outputs_size += sizeof(uint64_t);
#ifdef BUILD_ELEMENTS
            else {
                outputs_size += confidential_asset_length_from_bytes(tx->outputs[i].asset) +
                                confidential_value_length_from_bytes(tx->outputs[i].value) +
                                confidential_nonce_length_from_bytes(tx->outputs[i].nonce);

                if (sh_rangeproof) {
                    rangeproof_size += varbuff_get_length(tx->outputs[i].rangeproof_len) +
                                       varbuff_get_length(tx->outputs[i].surjectionproof_len);
                }
            }
#else
            else
                return WALLY_EINVAL;
#endif
            outputs_size += varbuff_get_length(tx->outputs[i].script_len);
        }
    }

#ifdef BUILD_ELEMENTS
    if (is_elements && !anyonecanpay) {
        for (i = 0; i < tx->num_inputs; ++i) {
            if (tx->inputs[i].features & WALLY_TX_IS_ISSUANCE)
                issuances_size +=
                    2 * WALLY_TX_ASSET_TAG_LEN +
                    confidential_value_length_from_bytes(tx->inputs[i].issuance_amount) +
                    confidential_value_length_from_bytes(tx->inputs[i].inflation_keys);
            else
                issuances_size += 1;
        }
    }
#endif

    if (inputs_size > buff_len || outputs_size > buff_len ||
        rangeproof_size > buff_len || issuances_size > buff_len) {
        buff_len = inputs_size > outputs_size ? inputs_size : outputs_size;
        buff_len = buff_len > rangeproof_size ? buff_len : rangeproof_size;
        buff_len = buff_len > issuances_size ? buff_len : issuances_size;
        buff_p = wally_malloc(buff_len);
        if (buff_p == NULL)
            return WALLY_ENOMEM;
    }

    /* Inputs */
    if (anyonecanpay)
        memset(p, 0, SHA256_LEN);
    else {
        for (i = 0; i < tx->num_inputs; ++i) {
            unsigned char *tmp_p = buff_p + i * (WALLY_TXHASH_LEN + sizeof(uint32_t));
            memcpy(tmp_p, tx->inputs[i].txhash, WALLY_TXHASH_LEN);
            uint32_to_le_bytes(tx->inputs[i].index, tmp_p + WALLY_TXHASH_LEN);
        }

        if ((ret = wally_sha256d(buff_p, inputs_size, p, SHA256_LEN)) != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

    /* Sequences */
    if (anyonecanpay || sh_single || sh_none)
        memset(p, 0, SHA256_LEN);
    else {
        for (i = 0; i < tx->num_inputs; ++i)
            uint32_to_le_bytes(tx->inputs[i].sequence, buff_p + i * sizeof(uint32_t));

        ret = wally_sha256d(buff_p, tx->num_inputs * sizeof(uint32_t), p, SHA256_LEN);
        if (ret != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

#ifdef BUILD_ELEMENTS
    if (is_elements) {
        /* Issuance */
        if (anyonecanpay)
            memset(p, 0, SHA256_LEN);
        else {
            unsigned char *tmp_p = buff_p;
            for (i = 0; i < tx->num_inputs; ++i) {
                if (tx->inputs[i].features & WALLY_TX_IS_ISSUANCE) {
                    memcpy(tmp_p, tx->inputs[i].blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
                    tmp_p += WALLY_TX_ASSET_TAG_LEN;
                    memcpy(tmp_p, tx->inputs[i].entropy, WALLY_TX_ASSET_TAG_LEN);
                    tmp_p += WALLY_TX_ASSET_TAG_LEN;
                    tmp_p += confidential_value_to_bytes(tx->inputs[i].issuance_amount,
                                                         tx->inputs[i].issuance_amount_len, tmp_p);
                    tmp_p += confidential_value_to_bytes(tx->inputs[i].inflation_keys,
                                                         tx->inputs[i].inflation_keys_len, tmp_p);
                }
                else
                    *tmp_p++ = 0;
            }

            if ((ret = wally_sha256d(buff_p, issuances_size, p, SHA256_LEN)) != WALLY_OK)
                goto error;
        }
        p += SHA256_LEN;
    }
#endif /* BUILD_ELEMENTS */

    /* Input details */
    memcpy(p, tx->inputs[opts->index].txhash, WALLY_TXHASH_LEN);
    p += WALLY_TXHASH_LEN;
    p += uint32_to_le_bytes(tx->inputs[opts->index].index, p);
    p += varbuff_to_bytes(opts->script, opts->script_len, p);
    if (!is_elements)
        p += uint64_to_le_bytes(opts->satoshi, p);
#ifdef BUILD_ELEMENTS
    else
        p += confidential_value_to_bytes(opts->value, opts->value_len, p);
#endif
    p += uint32_to_le_bytes(tx->inputs[opts->index].sequence, p);

#ifdef BUILD_ELEMENTS
    if (is_elements && (tx->inputs[opts->index].features & WALLY_TX_IS_ISSUANCE)) {
        memcpy(p, tx->inputs[opts->index].blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
        p += WALLY_TX_ASSET_TAG_LEN;
        memcpy(p, tx->inputs[opts->index].entropy, WALLY_TX_ASSET_TAG_LEN);
        p += WALLY_TX_ASSET_TAG_LEN;
        p += confidential_value_to_bytes(tx->inputs[opts->index].issuance_amount,
                                         tx->inputs[opts->index].issuance_amount_len, p);
        p += confidential_value_to_bytes(tx->inputs[opts->index].inflation_keys,
                                         tx->inputs[opts->index].inflation_keys_len, p);
    }
#endif

    /* Outputs */
    if (sh_none || (sh_single && opts->index >= tx->num_outputs))
        memset(p, 0, SHA256_LEN);
    else {
        output_p = buff_p;
        for (i = 0; i < tx->num_outputs; ++i) {
            if (sh_single && i != opts->index)
                continue;
            if (!is_elements)
                output_p += uint64_to_le_bytes(tx->outputs[i].satoshi, output_p);
#ifdef BUILD_ELEMENTS
            else {
                output_p += confidential_value_to_bytes(tx->outputs[i].asset, tx->outputs[i].asset_len,
                                                        output_p);
                output_p += confidential_value_to_bytes(tx->outputs[i].value, tx->outputs[i].value_len,
                                                        output_p);
                output_p += confidential_value_to_bytes(tx->outputs[i].nonce, tx->outputs[i].nonce_len,
                                                        output_p);
            }
#endif
            output_p += varbuff_to_bytes(tx->outputs[i].script,
                                         tx->outputs[i].script_len, output_p);
        }

        ret = wally_sha256d(buff_p, outputs_size, p, SHA256_LEN);
        if (ret != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

    /* rangeproof */
#ifdef BUILD_ELEMENTS
    if (is_elements && sh_rangeproof) {
        if (sh_none || (sh_single && opts->index >= tx->num_outputs))
            memset(p, 0, SHA256_LEN);
        else {
            output_p = buff_p;
            for (i = 0; i < tx->num_outputs; ++i) {
                if (sh_single && i != opts->index)
                    continue;
                output_p += varbuff_to_bytes(tx->outputs[i].rangeproof,
                                             tx->outputs[i].rangeproof_len, output_p);
                output_p += varbuff_to_bytes(tx->outputs[i].surjectionproof,
                                             tx->outputs[i].surjectionproof_len, output_p);
            }
            ret = wally_sha256d(buff_p, rangeproof_size, p, SHA256_LEN);
            if (ret != WALLY_OK)
                goto error;
        }
        p += SHA256_LEN;
    }
#endif

    /* nlocktime and sighash*/
    p += uint32_to_le_bytes(tx->locktime, p);
    p += uint32_to_le_bytes(opts->tx_sighash, p);

    *written = p - bytes_out;

error:
    if (buff_p != buff)
        clear_and_free(buff_p, buff_len);
    else
        wally_clear(buff, sizeof(buff));
    return ret;
}